

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O1

void __thiscall icu_63::RangeDescriptor::RangeDescriptor(RangeDescriptor *this,UErrorCode *status)

{
  UErrorCode UVar1;
  UVector *this_00;
  UVector *pUVar2;
  
  this->fStartChar = 0;
  this->fEndChar = 0;
  this->fNum = 0;
  this->fNext = (RangeDescriptor *)0x0;
  UVar1 = *status;
  this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status);
  pUVar2 = (UVector *)0x0;
  if (this_00 != (UVector *)0x0) {
    UVector::UVector(this_00,status);
    pUVar2 = this_00;
  }
  this->fIncludesSets = pUVar2;
  if (U_ZERO_ERROR < UVar1) {
    *status = UVar1;
  }
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (this->fIncludesSets == (UVector *)0x0)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RangeDescriptor::RangeDescriptor(UErrorCode &status) {
    this->fStartChar    = 0;
    this->fEndChar      = 0;
    this->fNum          = 0;
    this->fNext         = NULL;
    UErrorCode oldstatus = status;
    this->fIncludesSets = new UVector(status);
    if (U_FAILURE(oldstatus)) {
        status = oldstatus;
    }
    if (U_FAILURE(status)) {
        return;
    }
    /* test for NULL */
    if(this->fIncludesSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

}